

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O3

FastString __thiscall Strings::convert(Strings *this,ReadOnlyUnicodeString *string)

{
  byte bVar1;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *puVar2;
  uint uVar3;
  long lVar4;
  FastString FVar5;
  
  Bstrlib::String::String((String *)this);
  puVar2 = extraout_RDX;
  if (0 < string->length) {
    lVar4 = 0;
    do {
      uVar3 = string->data[lVar4];
      if (uVar3 < 0x80) {
LAB_001137dd:
        Bstrlib::String::operator+=((String *)this,(uchar)uVar3);
        puVar2 = extraout_RDX_00;
      }
      else {
        if (uVar3 < 0x800) {
          Bstrlib::String::operator+=((String *)this,(byte)(uVar3 >> 6) | 0xc0);
LAB_001137d5:
          uVar3 = (uint)((byte)uVar3 & 0x3f | 0x80);
          goto LAB_001137dd;
        }
        if (uVar3 < 0x10000) {
          Bstrlib::String::operator+=((String *)this,(byte)(uVar3 >> 0xc) | 0xe0);
          Bstrlib::String::operator+=((String *)this,(byte)(uVar3 >> 6) & 0x3f | 0x80);
          goto LAB_001137d5;
        }
        if (uVar3 < 0x200000) {
          Bstrlib::String::operator+=((String *)this,(byte)(uVar3 >> 0x12) | 0xf0);
          Bstrlib::String::operator+=((String *)this,(byte)(uVar3 >> 0xc) & 0x3f | 0x80);
          Bstrlib::String::operator+=((String *)this,(byte)(uVar3 >> 6) & 0x3f | 0x80);
          goto LAB_001137d5;
        }
        bVar1 = (byte)(uVar3 >> 0x18);
        if (uVar3 < 0x4000000) {
          Bstrlib::String::operator+=((String *)this,bVar1 | 0xf8);
          Bstrlib::String::operator+=((String *)this,(byte)(uVar3 >> 0x12) & 0x3f | 0x80);
          Bstrlib::String::operator+=((String *)this,(byte)(uVar3 >> 0xc) & 0x3f | 0x80);
          Bstrlib::String::operator+=((String *)this,(byte)(uVar3 >> 6) & 0x3f | 0x80);
          goto LAB_001137d5;
        }
        if (-1 < (int)uVar3) {
          Bstrlib::String::operator+=((String *)this,bVar1 >> 6 | 0xfc);
          Bstrlib::String::operator+=((String *)this,bVar1 & 0x3f | 0x80);
          Bstrlib::String::operator+=((String *)this,(byte)(uVar3 >> 0x12) & 0x3f | 0x80);
          Bstrlib::String::operator+=((String *)this,(byte)(uVar3 >> 0xc) & 0x3f | 0x80);
          Bstrlib::String::operator+=((String *)this,(byte)(uVar3 >> 6) & 0x3f | 0x80);
          goto LAB_001137d5;
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < string->length);
  }
  FVar5.super_tagbstring.data = puVar2;
  FVar5.super_tagbstring._0_8_ = this;
  return (FastString)FVar5.super_tagbstring;
}

Assistant:

FastString convert(const ReadOnlyUnicodeString & string)
    {
        FastString ret;
        for (int i = 0; i < string.getLength(); i++)
        {
            const uint32 c = string.getData()[i];

            // From http://www1.tip.nl/~t876506/utf8tbl.html#algo
            if (c < 0x80)
            {   // Single byte char
                ret += (uint8)c;
            } // Multi byte char
            else if (c < 0x800)
            {   // 2 bytes encoding
                ret += (uint8)(0xc0 | (c >> 6));
                ret += (uint8)(0x80 | (c & 0x3f));
            }
            else if (c < 0x10000)
            {   // 3 bytes encoding
                ret += (uint8)(0xe0 | (c >> 12));
                ret += (uint8)(0x80 | ( (c>>6) & 0x3f));
                ret += (uint8)(0x80 | (c & 0x3f));
            }
            else if (c < 0x200000)
            {   // 4 bytes encoding
                ret += (uint8)(0xf0 | (c >> 18));
                ret += (uint8)(0x80 | ( (c>>12) & 0x3f));
                ret += (uint8)(0x80 | ( (c>>6) & 0x3f));
                ret += (uint8)(0x80 | (c & 0x3f));
            }
            else if (c < 0x4000000)
            {   // 5 bytes encoding
                ret += (uint8)(0xf8 | (c >> 24));
                ret += (uint8)(0x80 | ( (c>>18) & 0x3f));
                ret += (uint8)(0x80 | ( (c>>12) & 0x3f));
                ret += (uint8)(0x80 | ( (c>>6) & 0x3f));
                ret += (uint8)(0x80 | (c & 0x3f));
            }
            else if (c < 0x80000000)
            {   // 6 bytes encoding
                ret += (uint8)(0xfc | (c >> 30));
                ret += (uint8)(0x80 | ( (c>>24) & 0x3f));
                ret += (uint8)(0x80 | ( (c>>18) & 0x3f));
                ret += (uint8)(0x80 | ( (c>>12) & 0x3f));
                ret += (uint8)(0x80 | ( (c>>6) & 0x3f));
                ret += (uint8)(0x80 | (c & 0x3f));
            } // else invalid Unicode char, so ignored
        }
        return ret;
    }